

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_raytracing_pipeline
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *member)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  ulonglong uVar3;
  bool bVar4;
  int iVar5;
  Ch *__nptr;
  const_iterator cVar6;
  undefined8 *puVar7;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_01;
  Type pGVar8;
  Number NVar9;
  mapped_type *ppVVar10;
  VkPipelineLibraryCreateInfoKHR *library_info;
  Hash hash;
  Data local_60;
  DatabaseInterface *local_50;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_48;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  ulonglong local_38;
  
  local_48 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)pipelines;
  __nptr = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(member);
  local_38 = strtoull(__nptr,(char **)0x0,0x10);
  cVar6 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->replayed_raytracing_pipelines)._M_h,&local_38);
  if (cVar6.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>._M_cur
      != (__node_type *)0x0) {
    return true;
  }
  local_50 = resolver;
  local_40 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->replayed_raytracing_pipelines;
  puVar7 = (undefined8 *)ScratchAllocator::allocate_raw(&this->allocator,0x68,0x10);
  if (puVar7 != (undefined8 *)0x0) {
    puVar7[10] = 0;
    puVar7[0xb] = 0;
    puVar7[8] = 0;
    puVar7[9] = 0;
    puVar7[6] = 0;
    puVar7[7] = 0;
    puVar7[4] = 0;
    puVar7[5] = 0;
    puVar7[2] = 0;
    puVar7[3] = 0;
    *puVar7 = 0;
    puVar7[1] = 0;
    puVar7[0xc] = 0;
  }
  this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         (local_48,member);
  *(undefined4 *)puVar7 = 0x3b9d13ff;
  pGVar8 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) {
LAB_0015781b:
    __assert_fail("data_.f.flags & kUintFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x719,
                  "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  *(SizeType *)(puVar7 + 2) = (pGVar8->data_).s.length;
  pGVar8 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"basePipelineIndex");
  if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x20000000000000) ==
      (undefined1  [16])0x0) {
    __assert_fail("data_.f.flags & kIntFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x718,
                  "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  *(SizeType *)(puVar7 + 0xc) = (pGVar8->data_).s.length;
  pGVar8 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"maxPipelineRayRecursionDepth");
  if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) goto LAB_0015781b;
  *(SizeType *)(puVar7 + 6) = (pGVar8->data_).s.length;
  *(uint *)(puVar7 + 2) = *(uint *)(puVar7 + 2) & 0x7ffffc3f;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_60.s,(Ch *)this_01);
  uVar1 = local_60.n;
  NVar9.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)this_01);
  if (uVar1 != NVar9.i64) {
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"stages");
    if ((pGVar8->data_).f.flags != 4) goto LAB_0015783a;
    *(SizeType *)((long)puVar7 + 0x14) = (pGVar8->data_).s.length;
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"stages");
    bVar4 = parse_stages(this,iface,local_50,pGVar8,(VkPipelineShaderStageCreateInfo **)(puVar7 + 3)
                        );
    if (!bVar4) {
      return false;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_60.s,(Ch *)this_01);
  uVar1 = local_60.n;
  NVar9.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)this_01);
  if (uVar1 != NVar9.i64) {
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"groups");
    if ((pGVar8->data_).f.flags != 4) {
LAB_0015783a:
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x66a,
                    "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    *(SizeType *)(puVar7 + 4) = (pGVar8->data_).s.length;
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"groups");
    bVar4 = parse_raytracing_groups
                      (this,pGVar8,(VkRayTracingShaderGroupCreateInfoKHR **)(puVar7 + 5));
    if (!bVar4) {
      return false;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_60.s,(Ch *)this_01);
  uVar1 = local_60.n;
  NVar9.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)this_01);
  if (uVar1 != NVar9.i64) {
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"libraryInterface");
    bVar4 = parse_library_interface
                      (this,pGVar8,(VkRayTracingPipelineInterfaceCreateInfoKHR **)(puVar7 + 8));
    if (!bVar4) {
      return false;
    }
  }
  local_60.o.members = (Member *)iface;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_60.s,(Ch *)this_01);
  uVar1 = local_60.n;
  NVar9.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)this_01);
  if (uVar1 != NVar9.i64) {
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"libraryInfo");
    local_60.n.i64 = (Number)0x0;
    bVar4 = parse_pipeline_library
                      (this,(StateCreatorInterface *)local_60.o.members,local_50,(Value *)local_48,
                       pGVar8,RESOURCE_RAYTRACING_PIPELINE,
                       (VkPipelineLibraryCreateInfoKHR **)&local_60.n);
    if (!bVar4) {
      return false;
    }
    ((Number *)(puVar7 + 7))->i64 = (int64_t)local_60.n;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_60.s,(Ch *)this_01);
  uVar1 = local_60.n;
  NVar9.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)this_01);
  if (uVar1 != NVar9.i64) {
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"dynamicState");
    parse_dynamic_state(this,pGVar8,(VkPipelineDynamicStateCreateInfo **)(puVar7 + 9));
  }
  pGVar8 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_01,"basePipelineHandle");
  bVar4 = parse_derived_pipeline_handle
                    (this,(StateCreatorInterface *)local_60.o.members,local_50,pGVar8,
                     (Value *)local_48,RESOURCE_RAYTRACING_PIPELINE,(VkPipeline *)(puVar7 + 0xb));
  if (bVar4) {
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"layout");
    bVar4 = parse_pipeline_layout_handle(this,pGVar8,(VkPipelineLayout *)(puVar7 + 10));
    if (bVar4) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_60.s,(Ch *)this_01);
      uVar1 = local_60.n;
      NVar9.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)this_01);
      this_00 = local_40;
      uVar2 = local_60.o.members;
      if (uVar1 != NVar9.i64) {
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_01,"pNext");
        bVar4 = parse_pnext_chain(this,pGVar8,(void **)(puVar7 + 1),(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar4) {
          return false;
        }
      }
      uVar3 = local_38;
      ppVVar10 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](this_00,&local_38);
      iVar5 = (*(*(_func_int ***)uVar2)[0xd])(uVar2,uVar3,puVar7,ppVVar10);
      return (bool)(char)iVar5;
    }
  }
  return false;
}

Assistant:

bool StateReplayer::Impl::parse_raytracing_pipeline(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                    const Value &pipelines, const Value &member)
{
	Hash hash = string_to_uint64(member.GetString());
	if (replayed_raytracing_pipelines.count(hash))
		return true;

	auto *info_allocated = allocator.allocate_cleared<VkRayTracingPipelineCreateInfoKHR>();
	auto &obj = pipelines[member];
	auto &info = *info_allocated;
	info.sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
	info.flags = obj["flags"].GetUint();
	info.basePipelineIndex = obj["basePipelineIndex"].GetInt();
	info.maxPipelineRayRecursionDepth = obj["maxPipelineRayRecursionDepth"].GetUint();

	// For older captures, we might have captured these flags.
	info.flags = normalize_pipeline_creation_flags(info.flags);

	if (obj.HasMember("stages"))
	{
		info.stageCount = obj["stages"].Size();
		if (!parse_stages(iface, resolver, obj["stages"], &info.pStages))
			return false;
	}

	if (obj.HasMember("groups"))
	{
		info.groupCount = obj["groups"].Size();
		if (!parse_raytracing_groups(obj["groups"], &info.pGroups))
			return false;
	}

	if (obj.HasMember("libraryInterface"))
		if (!parse_library_interface(obj["libraryInterface"], &info.pLibraryInterface))
			return false;

	if (obj.HasMember("libraryInfo"))
	{
		auto &lib_info = obj["libraryInfo"];
		VkPipelineLibraryCreateInfoKHR *library_info = nullptr;
		if (!parse_pipeline_library(iface, resolver, pipelines, lib_info, RESOURCE_RAYTRACING_PIPELINE, &library_info))
			return false;
		info.pLibraryInfo = library_info;
	}

	if (obj.HasMember("dynamicState"))
		if (!parse_dynamic_state(obj["dynamicState"], &info.pDynamicState))
			return false;

	if (!parse_derived_pipeline_handle(iface, resolver, obj["basePipelineHandle"], pipelines,
	                                   RESOURCE_RAYTRACING_PIPELINE, &info.basePipelineHandle))
		return false;

	if (!parse_pipeline_layout_handle(obj["layout"], &info.layout))
		return false;

	if (obj.HasMember("pNext"))
		if (!parse_pnext_chain(obj["pNext"], &info.pNext))
			return false;

	if (!iface.enqueue_create_raytracing_pipeline(hash, &info, &replayed_raytracing_pipelines[hash]))
		return false;

	return true;
}